

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float32_unordered_quiet_mips64(float32 a,float32 b,float_status *status)

{
  float32 a_;
  float32 a__00;
  int iVar1;
  int iVar2;
  
  a_ = float32_squash_input_denormal_mips64(a,status);
  a__00 = float32_squash_input_denormal_mips64(b,status);
  if (((~a_ & 0x7f800000) == 0 && (a_ & 0x7fffff) != 0) ||
     (iVar2 = 0, (a__00 & 0x7fffff) != 0 && (~a__00 & 0x7f800000) == 0)) {
    iVar1 = float32_is_signaling_nan_mips64(a_,status);
    iVar2 = 1;
    if ((iVar1 == 0) && (iVar1 = float32_is_signaling_nan_mips64(a__00,status), iVar1 == 0)) {
      return 1;
    }
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  return iVar2;
}

Assistant:

int float32_unordered_quiet(float32 a, float32 b, float_status *status)
{
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        if (float32_is_signaling_nan(a, status)
         || float32_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}